

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O3

FlatTerm * Kernel::FlatTerm::create(TermList t)

{
  FlatTerm *pFVar1;
  
  if ((t._content & 3) != 0) {
    pFVar1 = (FlatTerm *)operator_new(t._content,1);
    pFVar1->_length = 1;
    pFVar1->_data[0]._content = (ulong)((uint)t._content & 0x1ffffffc) * 2 + 2;
    return pFVar1;
  }
  pFVar1 = create((Term *)t._content);
  return pFVar1;
}

Assistant:

FlatTerm* FlatTerm::create(TermList t)
{
  if(t.isTerm()) {
    return create(t.term());
  }
  ASS(t.isOrdinaryVar());


  FlatTerm* res=new(1) FlatTerm(1);
  res->_data[0]=Entry(VAR, t.var());

  return res;
}